

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shape.h
# Opt level: O2

Shape * __thiscall Shape::addPolygon(Shape *this,Polygon *p)

{
  Polygon *pPVar1;
  int iVar2;
  undefined1 auVar3 [16];
  ulong *puVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  Polygon *pPVar8;
  int i;
  long lVar9;
  
  iVar2 = this->size;
  uVar7 = (ulong)(iVar2 + 1);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar7;
  uVar6 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0x50),8) == 0) {
    uVar6 = SUB168(auVar3 * ZEXT816(0x50),0) | 8;
  }
  puVar4 = (ulong *)operator_new__(uVar6);
  pPVar1 = (Polygon *)(puVar4 + 1);
  *puVar4 = uVar7;
  if (iVar2 != -1) {
    lVar5 = 0;
    pPVar8 = pPVar1;
    do {
      Polygon::Polygon(pPVar8);
      lVar5 = lVar5 + -0x50;
      pPVar8 = pPVar8 + 0x50;
    } while (uVar7 * -0x50 - lVar5 != 0);
  }
  lVar9 = 0;
  lVar5 = 0;
  while( true ) {
    iVar2 = this->size;
    if (iVar2 <= lVar5) break;
    Polygon::operator=(pPVar1 + lVar9,this->polygons + lVar9);
    lVar5 = lVar5 + 1;
    lVar9 = lVar9 + 0x50;
  }
  this->size = iVar2 + 1;
  Polygon::operator=(pPVar1 + (long)iVar2 * 0x50,p);
  pPVar8 = this->polygons;
  if (pPVar8 != (Polygon *)0x0) {
    if (*(long *)(pPVar8 + -8) != 0) {
      lVar5 = *(long *)(pPVar8 + -8) * 0x50;
      do {
        Polygon::~Polygon(pPVar8 + lVar5 + -0x50);
        lVar5 = lVar5 + -0x50;
      } while (lVar5 != 0);
    }
    operator_delete__(pPVar8 + -8);
  }
  this->polygons = pPVar1;
  return this;
}

Assistant:

Shape& addPolygon(const Polygon& p) {
    Polygon* newPolygons = new Polygon[size + 1];
    for(int i = 0; i < size; i++) {
      newPolygons[i] = polygons[i];
    }
    newPolygons[size++] = p;
    if (polygons != NULL) delete[] polygons;
    polygons = newPolygons;

    return *this;
  }